

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_is_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  _Bool _Var1;
  container_t *c1_00;
  container_t *c2_00;
  container_t *c2;
  container_t *c1;
  uint8_t type2;
  int iStack_40;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int pos2;
  int pos1;
  int length2;
  int length1;
  roaring_array_t *ra2;
  roaring_array_t *ra1;
  roaring_bitmap_t *r2_local;
  roaring_bitmap_t *r1_local;
  
  pos1 = (r1->high_low_container).size;
  pos2 = (r2->high_low_container).size;
  _s2 = 0;
  iStack_40 = 0;
  _length2 = &r2->high_low_container;
  ra2 = &r1->high_low_container;
  ra1 = &r2->high_low_container;
  r2_local = r1;
  while( true ) {
    while( true ) {
      if (pos1 <= _s2 || pos2 <= iStack_40) {
        return _s2 == pos1;
      }
      c1._6_2_ = ra_get_key_at_index(ra2,(uint16_t)_s2);
      c1._4_2_ = ra_get_key_at_index(_length2,(uint16_t)iStack_40);
      if (c1._6_2_ != c1._4_2_) break;
      c1_00 = ra_get_container_at_index(ra2,(uint16_t)_s2,(uint8_t *)((long)&c1 + 3));
      c2_00 = ra_get_container_at_index(_length2,(uint16_t)iStack_40,(uint8_t *)((long)&c1 + 2));
      _Var1 = container_is_subset(c1_00,c1._3_1_,c2_00,c1._2_1_);
      if (!_Var1) {
        return false;
      }
      _s2 = _s2 + 1;
      iStack_40 = iStack_40 + 1;
    }
    if (c1._6_2_ < c1._4_2_) break;
    iStack_40 = ra_advance_until(_length2,c1._6_2_,iStack_40);
  }
  return false;
}

Assistant:

bool roaring_bitmap_is_subset(const roaring_bitmap_t *r1,
                              const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    const int length1 = ra1->size,
              length2 = ra2->size;

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(ra1, pos1);
        const uint16_t s2 = ra_get_key_at_index(ra2, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(ra1, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(ra2, pos2, &type2);
            if (!container_is_subset(c1, type1, c2, type2))
                return false;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            return false;
        } else {  // s1 > s2
            pos2 = ra_advance_until(ra2, s1, pos2);
        }
    }
    if (pos1 == length1)
        return true;
    else
        return false;
}